

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::addAll(UnicodeSet *this,UnicodeSet *c)

{
  UBool UVar1;
  UnicodeString *s;
  int32_t i;
  int index;
  UVector *this_00;
  
  if ((0 < c->len) && (c->list != (UChar32 *)0x0)) {
    add(this,c->list,c->len,'\0');
  }
  this_00 = c->strings;
  if (this_00 != (UVector *)0x0) {
    for (index = 0; index < this_00->count; index = index + 1) {
      s = (UnicodeString *)UVector::elementAt(this_00,index);
      UVar1 = UVector::contains(this->strings,s);
      if (UVar1 == '\0') {
        _add(this,s);
      }
      this_00 = c->strings;
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::addAll(const UnicodeSet& c) {
    if ( c.len>0 && c.list!=NULL ) {
        add(c.list, c.len, 0);
    }

    // Add strings in order
    if ( c.strings!=NULL ) {
        for (int32_t i=0; i<c.strings->size(); ++i) {
            const UnicodeString* s = (const UnicodeString*)c.strings->elementAt(i);
            if (!strings->contains((void*) s)) {
                _add(*s);
            }
        }
    }
    return *this;
}